

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_DEEP_DESCENT(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  player *p;
  wchar_t place;
  uint32_t uVar2;
  level_conflict *plVar3;
  long lVar4;
  uint uVar5;
  
  place = (wchar_t)player->place;
  uVar5 = 6;
  do {
    plVar3 = world->levels;
    lVar4 = (long)place;
    if (plVar3[lVar4].down == (char *)0x0) goto LAB_0013e3f6;
    place = player_get_next_place(place,"down",L'\x01');
    uVar5 = uVar5 - 1;
  } while (1 < uVar5);
  plVar3 = world->levels;
  lVar4 = (long)place;
LAB_0013e3f6:
  if ((int)player->depth < plVar3[lVar4].depth) {
    msgt(0x19,"The air around you starts to swirl...");
    uVar2 = Rand_div(4);
    p = player;
    player->deep_descent = (short)uVar2 + 4;
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x2000;
    handle_stuff(p);
  }
  else {
    msgt(0x19,"You sense a malevolent presence blocking passage to the levels below.");
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DEEP_DESCENT(effect_handler_context_t *context)
{
	int i, number, target_place = player->place;
	struct level *lev;

	/* Calculate target place */
	//number = (4 / z_info->stair_skip) + 1;
	number = 1;
 	for (i = 5; i > 0; i--) {
		if (!world->levels[target_place].down) break;
		target_place = player_get_next_place(target_place, "down", number);
 	}

	lev = &world->levels[target_place];

	if (lev->depth > player->depth) {
		msgt(MSG_TPLEVEL, "The air around you starts to swirl...");
		player->deep_descent = 3 + randint1(4);

		/* Redraw status line */
		player->upkeep->redraw |= PR_STATUS;
		handle_stuff(player);
	} else {
		msgt(MSG_TPLEVEL, "You sense a malevolent presence blocking passage to the levels below.");
	}
	context->ident = true;
	return true;
}